

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O3

void Llb_ManPrepareVarLimits(Llb_Man_t *p)

{
  uint uVar1;
  Aig_Man_t *pAVar2;
  Llb_Mtr_t *pLVar3;
  Llb_Grp_t **ppLVar4;
  Llb_Grp_t *pLVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  undefined1 auVar9 [16];
  Vec_Int_t *pVVar10;
  int *__s;
  Vec_Int_t *pVVar11;
  int *__s_00;
  long lVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  int iVar21;
  
  if (p->vVarBegs != (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarBegs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Man.c"
                  ,0x5d,"void Llb_ManPrepareVarLimits(Llb_Man_t *)");
  }
  if (p->vVarEnds != (Vec_Int_t *)0x0) {
    __assert_fail("p->vVarEnds == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Man.c"
                  ,0x5e,"void Llb_ManPrepareVarLimits(Llb_Man_t *)");
  }
  pAVar2 = p->pAig;
  iVar13 = pAVar2->vObjs->nSize;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar17 = iVar13;
  if (iVar13 - 1U < 0xf) {
    iVar17 = 0x10;
  }
  pVVar10->nCap = iVar17;
  if (iVar17 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar17 << 2);
  }
  pVVar10->pArray = __s;
  pVVar10->nSize = iVar13;
  __s_00 = (int *)0x0;
  memset(__s,0,(long)iVar13 << 2);
  p->vVarEnds = pVVar10;
  iVar13 = pAVar2->vObjs->nSize;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  iVar17 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar17 = iVar13;
  }
  pVVar11->nCap = iVar17;
  if (iVar17 != 0) {
    __s_00 = (int *)malloc((long)iVar17 << 2);
  }
  pVVar11->pArray = __s_00;
  pVVar11->nSize = iVar13;
  memset(__s_00,0,(long)iVar13 << 2);
  p->vVarBegs = pVVar11;
  uVar1 = pAVar2->vObjs->nSize;
  pLVar3 = p->pMatrix;
  iVar13 = pLVar3->nCols;
  if (iVar17 < (int)uVar1) {
    if (__s_00 == (int *)0x0) {
      __s_00 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      __s_00 = (int *)realloc(__s_00,(long)(int)uVar1 << 2);
    }
    pVVar11->pArray = __s_00;
    if (__s_00 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar11->nCap = uVar1;
  }
  auVar9 = _DAT_007ee2e0;
  if (0 < (int)uVar1) {
    lVar12 = (ulong)uVar1 - 1;
    auVar16._8_4_ = (int)lVar12;
    auVar16._0_8_ = lVar12;
    auVar16._12_4_ = (int)((ulong)lVar12 >> 0x20);
    lVar12 = 0;
    auVar16 = auVar16 ^ _DAT_007ee2e0;
    auVar18 = _DAT_007ee2c0;
    auVar19 = _DAT_007ee2d0;
    do {
      auVar20 = auVar19 ^ auVar9;
      iVar17 = auVar16._4_4_;
      if ((bool)(~(auVar20._4_4_ == iVar17 && auVar16._0_4_ < auVar20._0_4_ ||
                  iVar17 < auVar20._4_4_) & 1)) {
        *(int *)((long)__s_00 + lVar12) = iVar13;
      }
      if ((auVar20._12_4_ != auVar16._12_4_ || auVar20._8_4_ <= auVar16._8_4_) &&
          auVar20._12_4_ <= auVar16._12_4_) {
        *(int *)((long)__s_00 + lVar12 + 4) = iVar13;
      }
      auVar20 = auVar18 ^ auVar9;
      iVar21 = auVar20._4_4_;
      if (iVar21 <= iVar17 && (iVar21 != iVar17 || auVar20._0_4_ <= auVar16._0_4_)) {
        *(int *)((long)__s_00 + lVar12 + 8) = iVar13;
        *(int *)((long)__s_00 + lVar12 + 0xc) = iVar13;
      }
      lVar14 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar14 + 4;
      lVar14 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 4;
      auVar18._8_8_ = lVar14 + 4;
      lVar12 = lVar12 + 0x10;
    } while ((ulong)(uVar1 + 3 >> 2) << 4 != lVar12);
  }
  pVVar11->nSize = uVar1;
  if (0 < pLVar3->nCols) {
    ppLVar4 = pLVar3->pColGrps;
    lVar12 = 0;
    do {
      pLVar5 = ppLVar4[lVar12];
      pVVar6 = pLVar5->vIns;
      iVar13 = pVVar6->nSize;
      iVar17 = (int)lVar12;
      if (0 < iVar13) {
        ppvVar7 = pVVar6->pArray;
        lVar14 = 0;
        do {
          iVar21 = *(int *)((long)ppvVar7[lVar14] + 0x24);
          lVar15 = (long)iVar21;
          if ((lVar15 < 0) || (pVVar11->nSize <= iVar21)) goto LAB_007d2539;
          if (lVar12 < __s_00[lVar15]) {
            __s_00[lVar15] = iVar17;
            iVar13 = pVVar6->nSize;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < iVar13);
      }
      pVVar8 = pLVar5->vOuts;
      iVar21 = pVVar8->nSize;
      if (0 < iVar21) {
        ppvVar7 = pVVar8->pArray;
        lVar14 = 0;
        do {
          iVar13 = *(int *)((long)ppvVar7[lVar14] + 0x24);
          lVar15 = (long)iVar13;
          if ((lVar15 < 0) || (pVVar11->nSize <= iVar13)) goto LAB_007d2539;
          if (lVar12 < __s_00[lVar15]) {
            __s_00[lVar15] = iVar17;
            iVar21 = pVVar8->nSize;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < iVar21);
        iVar13 = pVVar6->nSize;
      }
      if (0 < iVar13) {
        ppvVar7 = pVVar6->pArray;
        lVar14 = 0;
        do {
          iVar21 = *(int *)((long)ppvVar7[lVar14] + 0x24);
          lVar15 = (long)iVar21;
          if ((lVar15 < 0) || (pVVar10->nSize <= iVar21)) goto LAB_007d2539;
          if (__s[lVar15] < lVar12) {
            __s[lVar15] = iVar17;
            iVar13 = pVVar6->nSize;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < iVar13);
        iVar21 = pVVar8->nSize;
      }
      if (0 < iVar21) {
        ppvVar7 = pVVar8->pArray;
        lVar14 = 0;
        do {
          iVar13 = *(int *)((long)ppvVar7[lVar14] + 0x24);
          lVar15 = (long)iVar13;
          if ((lVar15 < 0) || (pVVar10->nSize <= iVar13)) {
LAB_007d2539:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if (__s[lVar15] < lVar12) {
            __s[lVar15] = iVar17;
            iVar21 = pVVar8->nSize;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < iVar21);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pLVar3->nCols);
  }
  return;
}

Assistant:

void Llb_ManPrepareVarLimits( Llb_Man_t * p )
{
    Llb_Grp_t * pGroup;
    Aig_Obj_t * pVar;
    int i, k;
    assert( p->vVarBegs == NULL );
    assert( p->vVarEnds == NULL );
    p->vVarEnds = Vec_IntStart( Aig_ManObjNumMax(p->pAig) ); 
    p->vVarBegs = Vec_IntStart( Aig_ManObjNumMax(p->pAig) ); 
    Vec_IntFill( p->vVarBegs, Aig_ManObjNumMax(p->pAig), p->pMatrix->nCols );

    for ( i = 0; i < p->pMatrix->nCols; i++ )
    {
        pGroup = p->pMatrix->pColGrps[i];

        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) > i )
                Vec_IntWriteEntry( p->vVarBegs, pVar->Id, i );
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarBegs, pVar->Id) > i )
                Vec_IntWriteEntry( p->vVarBegs, pVar->Id, i );

        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) < i )
                Vec_IntWriteEntry( p->vVarEnds, pVar->Id, i );
        Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pVar, k )
            if ( Vec_IntEntry(p->vVarEnds, pVar->Id) < i )
                Vec_IntWriteEntry( p->vVarEnds, pVar->Id, i );
    }
}